

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void writeLZ77data(size_t *bp,ucvector *out,uivector *lz77_encoded,HuffmanTree *tree_ll,
                  HuffmanTree *tree_d)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint value;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  
  for (sVar7 = 0; sVar7 != lz77_encoded->size; sVar7 = sVar7 + 1) {
    uVar1 = lz77_encoded->data[sVar7];
    uVar6 = (ulong)uVar1;
    addHuffmanSymbol(bp,out,tree_ll->tree1d[uVar6],tree_ll->lengths[uVar6]);
    if (0x100 < uVar6) {
      puVar4 = lz77_encoded->data;
      lVar5 = sVar7 + 1;
      uVar2 = puVar4[sVar7 + 2];
      uVar3 = DISTANCEEXTRA[uVar2];
      value = puVar4[sVar7 + 3];
      sVar7 = sVar7 + 3;
      addBitsToStream(bp,out,puVar4[lVar5],(ulong)LENGTHEXTRA[uVar1 - 0x101]);
      addHuffmanSymbol(bp,out,tree_d->tree1d[uVar2],tree_d->lengths[uVar2]);
      addBitsToStream(bp,out,value,(ulong)uVar3);
    }
  }
  return;
}

Assistant:

static void writeLZ77data(size_t* bp, ucvector* out, const uivector* lz77_encoded,
	const HuffmanTree* tree_ll, const HuffmanTree* tree_d)
{
	size_t i = 0;
	for (i = 0; i != lz77_encoded->size; ++i)
	{
		unsigned val = lz77_encoded->data[i];
		addHuffmanSymbol(bp, out, HuffmanTree_getCode(tree_ll, val), HuffmanTree_getLength(tree_ll, val));
		if (val > 256) /*for a length code, 3 more things have to be added*/
		{
			unsigned length_index = val - FIRST_LENGTH_CODE_INDEX;
			unsigned n_length_extra_bits = LENGTHEXTRA[length_index];
			unsigned length_extra_bits = lz77_encoded->data[++i];

			unsigned distance_code = lz77_encoded->data[++i];

			unsigned distance_index = distance_code;
			unsigned n_distance_extra_bits = DISTANCEEXTRA[distance_index];
			unsigned distance_extra_bits = lz77_encoded->data[++i];

			addBitsToStream(bp, out, length_extra_bits, n_length_extra_bits);
			addHuffmanSymbol(bp, out, HuffmanTree_getCode(tree_d, distance_code),
				HuffmanTree_getLength(tree_d, distance_code));
			addBitsToStream(bp, out, distance_extra_bits, n_distance_extra_bits);
		}
	}
}